

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::HardSigmoid_x86_fma::forward_inplace
          (HardSigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar15 [16];
  undefined4 uVar14;
  undefined1 auVar16 [32];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar4 = 0;
    auVar10._8_4_ = 0x3f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._12_4_ = 0x3f800000;
    auVar10._16_4_ = 0x3f800000;
    auVar10._20_4_ = 0x3f800000;
    auVar10._24_4_ = 0x3f800000;
    auVar10._28_4_ = 0x3f800000;
    auVar11._8_4_ = 0x3f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._12_4_ = 0x3f800000;
    do {
      pauVar5 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar3 < 8) {
        uVar7 = 0;
      }
      else {
        iVar6 = 7;
        do {
          fVar1 = (this->super_HardSigmoid).beta;
          auVar13._4_4_ = fVar1;
          auVar13._0_4_ = fVar1;
          auVar13._8_4_ = fVar1;
          auVar13._12_4_ = fVar1;
          auVar13._16_4_ = fVar1;
          auVar13._20_4_ = fVar1;
          auVar13._24_4_ = fVar1;
          auVar13._28_4_ = fVar1;
          fVar1 = (this->super_HardSigmoid).alpha;
          auVar16._4_4_ = fVar1;
          auVar16._0_4_ = fVar1;
          auVar16._8_4_ = fVar1;
          auVar16._12_4_ = fVar1;
          auVar16._16_4_ = fVar1;
          auVar16._20_4_ = fVar1;
          auVar16._24_4_ = fVar1;
          auVar16._28_4_ = fVar1;
          auVar12 = vfmadd132ps_fma(auVar16,auVar13,*pauVar5);
          auVar13 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(ZEXT816(0) << 0x40));
          auVar13 = vminps_avx(auVar13,auVar10);
          *pauVar5 = auVar13;
          pauVar5 = pauVar5 + 1;
          iVar6 = iVar6 + 8;
          uVar7 = uVar3 & 0xfffffff8;
        } while (iVar6 < (int)uVar3);
      }
      uVar9 = uVar7 | 3;
      while ((int)uVar9 < (int)uVar3) {
        fVar1 = (this->super_HardSigmoid).beta;
        auVar12._4_4_ = fVar1;
        auVar12._0_4_ = fVar1;
        auVar12._8_4_ = fVar1;
        auVar12._12_4_ = fVar1;
        fVar1 = (this->super_HardSigmoid).alpha;
        auVar15._4_4_ = fVar1;
        auVar15._0_4_ = fVar1;
        auVar15._8_4_ = fVar1;
        auVar15._12_4_ = fVar1;
        auVar12 = vfmadd132ps_fma(auVar15,auVar12,*(undefined1 (*) [16])*pauVar5);
        auVar12 = vmaxps_avx(auVar12,ZEXT816(0) << 0x40);
        auVar12 = vminps_avx(auVar12,auVar11);
        *(undefined1 (*) [16])*pauVar5 = auVar12;
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
        uVar9 = uVar7 + 7;
        uVar7 = uVar7 + 4;
      }
      if (uVar3 - uVar7 != 0 && (int)uVar7 <= (int)uVar3) {
        lVar8 = 0;
        do {
          fVar1 = *(float *)(*pauVar5 + lVar8 * 4);
          uVar14 = 0;
          if (((this->super_HardSigmoid).lower <= fVar1) &&
             (uVar14 = 0x3f800000, fVar1 <= (this->super_HardSigmoid).upper)) {
            auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                      ZEXT416((uint)(this->super_HardSigmoid).alpha),
                                      ZEXT416((uint)(this->super_HardSigmoid).beta));
            uVar14 = auVar12._0_4_;
          }
          *(undefined4 *)(*pauVar5 + lVar8 * 4) = uVar14;
          lVar8 = lVar8 + 1;
        } while (uVar3 - uVar7 != (int)lVar8);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar2);
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}